

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O2

void __thiscall dynamicgraph::Signal<double,_int>::Signal(Signal<double,_int> *this,string *name)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  SignalBase<int>::SignalBase(&this->super_SignalBase<int>,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_SignalBase<int>)._vptr_SignalBase = (_func_int **)&PTR__Signal_0012ef58;
  this->signalType = CONSTANT;
  this->Tcopy1 = 0.0;
  this->Tcopy2 = 0.0;
  this->Tcopy = &this->Tcopy1;
  this->providerMutex = (Mutex *)0x0;
  this->Treference = (double *)0x0;
  this->TreferenceNonConst = (double *)0x0;
  (this->Tfunction).super_function_base.vtable = (vtable_base *)0x0;
  *(undefined8 *)&(this->Tfunction).super_function_base.functor = 0;
  *(undefined8 *)((long)&(this->Tfunction).super_function_base.functor + 8) = 0;
  *(undefined8 *)((long)&(this->Tfunction).super_function_base.functor + 0x10) = 0;
  this->keepReference = false;
  return;
}

Assistant:

Signal<T, Time>::Signal(std::string name)
    : __SIGNAL_INIT(name, T(), NULL, NULL, NULL) {
  return;
}